

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionEulerSimple::ComputeQuadraticTerms
          (ChBeamSectionEulerSimple *this,ChVector<double> *mF,ChVector<double> *mT,
          ChVector<double> *mW)

{
  if (mF != (ChVector<double> *)&VNULL) {
    mF->m_data[0] = VNULL;
    mF->m_data[1] = DAT_00b90ac0;
    mF->m_data[2] = DAT_00b90ac8;
  }
  if (mT != (ChVector<double> *)&VNULL) {
    mT->m_data[0] = VNULL;
    mT->m_data[1] = DAT_00b90ac0;
    mT->m_data[2] = DAT_00b90ac8;
  }
  return;
}

Assistant:

inline ChVector<Real>& ChVector<Real>::operator=(const ChVector<Real>& other) {
    if (&other == this)
        return *this;
    m_data[0] = other.m_data[0];
    m_data[1] = other.m_data[1];
    m_data[2] = other.m_data[2];
    return *this;
}